

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O2

long testIntegerToString(int count)

{
  long lVar1;
  long lVar2;
  signed_int extraout_EDX;
  signed_int value;
  signed_int extraout_EDX_00;
  int iVar3;
  bool bVar4;
  string local_40;
  
  lVar1 = GetTickCount();
  iVar3 = 0;
  if (0 < count) {
    iVar3 = count;
  }
  value = extraout_EDX;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    FIX::IntConvertor::convert_abi_cxx11_(&local_40,(IntConvertor *)0x4d2,value);
    std::__cxx11::string::~string((string *)&local_40);
    value = extraout_EDX_00;
  }
  lVar2 = GetTickCount();
  return lVar2 - lVar1;
}

Assistant:

long testIntegerToString( int count )
{
  count = count - 1;

  long start = GetTickCount();
  for ( int i = 0; i <= count; ++i )
  {
    FIX::IntConvertor::convert( 1234 );
  }
  return GetTickCount() - start;
}